

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O2

void m68k_op_lea_32_di(void)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = m68ki_cpu.dar[(ulong)(m68ki_cpu.ir & 7) + 8];
  uVar2 = m68ki_read_imm_16();
  *(uint *)((long)m68ki_cpu.dar + (ulong)(m68ki_cpu.ir >> 7 & 0x1c) + 0x20) =
       (int)(short)uVar2 + uVar1;
  return;
}

Assistant:

static void m68k_op_lea_32_di(void)
{
	AX = EA_AY_DI_32();
}